

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tidy.c
# Opt level: O0

void printOption(TidyDoc tdoc,TidyOption topt,OptionDesc *d)

{
  TidyConfigCategory TVar1;
  tmbstr local_30;
  tmbstr val;
  ctmbstr pval;
  OptionDesc *d_local;
  TidyOption topt_local;
  TidyDoc tdoc_local;
  
  TVar1 = tidyOptGetCategory(topt);
  if ((TVar1 != TidyInternalCategory) && ((*d->name != '\0' || (*d->type != '\0')))) {
    val = d->vals;
    local_30 = (tmbstr)0x0;
    if (d->haveVals == no) {
      val = "-";
    }
    else if (val == (ctmbstr)0x0) {
      local_30 = GetAllowedValues(topt,d);
      val = local_30;
    }
    print3Columns("%-27.27s %-9.9s  %-40.40s\n",0x1b,9,0x28,d->name,d->type,val);
    if (local_30 != (tmbstr)0x0) {
      free(local_30);
    }
  }
  return;
}

Assistant:

static void printOption(TidyDoc ARG_UNUSED(tdoc), /**< The Tidy document. */
                        TidyOption topt,          /**< The option to print. */
                        OptionDesc *d             /**< A pointer to the OptionDesc array. */
                        )
{
    if (tidyOptGetCategory( topt ) == TidyInternalCategory )
        return;

    if ( *d->name || *d->type )
    {
        ctmbstr pval = d->vals;
        tmbstr val = NULL;
        if (!d->haveVals)
        {
            pval = "-";
        }
        else if (pval == NULL)
        {
            val = GetAllowedValues( topt, d);
            pval = val;
        }
        print3Columns( fmt, 27, 9, 40, d->name, d->type, pval );
        if (val)
            free(val);
    }
}